

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

bool __thiscall kj::EventLoop::turn(EventLoop *this)

{
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:1836:7)>
  DVar1;
  Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> local_80;
  Type local_70;
  undefined1 local_68 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:1836:7)>
  _kjDefer1836;
  Type local_48;
  undefined1 local_40 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:1834:7)>
  _kjDefer1834;
  Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> eventToDestroy;
  Event *event;
  EventLoop *this_local;
  
  eventToDestroy.ptr.ptr = this->head;
  if (eventToDestroy.ptr.ptr == (Event *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this->head = (eventToDestroy.ptr.ptr)->next;
    if (this->head != (Event *)0x0) {
      this->head->prev = &this->head;
    }
    this->depthFirstInsertPoint = &this->head;
    if (this->breadthFirstInsertPoint == &(eventToDestroy.ptr.ptr)->next) {
      this->breadthFirstInsertPoint = &this->head;
    }
    if (this->tail == &(eventToDestroy.ptr.ptr)->next) {
      this->tail = &this->head;
    }
    (eventToDestroy.ptr.ptr)->next = (Event *)0x0;
    (eventToDestroy.ptr.ptr)->prev = (Event **)0x0;
    Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>::Maybe
              ((Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> *)
               &_kjDefer1834.maybeFunc.ptr.field_1.value);
    (eventToDestroy.ptr.ptr)->firing = true;
    local_48.event = &eventToDestroy.ptr.ptr;
    defer<kj::EventLoop::turn()::__0>((kj *)local_40,&local_48);
    this->currentlyFiring = eventToDestroy.ptr.ptr;
    local_70.this = this;
    DVar1 = defer<kj::EventLoop::turn()::__1>((kj *)local_68,&local_70);
    (*(eventToDestroy.ptr.ptr)->_vptr_Event[1])
              (&local_80,eventToDestroy.ptr.ptr,DVar1.maybeFunc.ptr.field_1);
    Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>::operator=
              ((Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> *)
               &_kjDefer1834.maybeFunc.ptr.field_1.value,&local_80);
    Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>::~Maybe(&local_80);
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:1836:7)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:1836:7)>
                 *)local_68);
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:1834:7)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:1834:7)>
                 *)local_40);
    this->depthFirstInsertPoint = &this->head;
    this_local._7_1_ = true;
    Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>::~Maybe
              ((Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> *)
               &_kjDefer1834.maybeFunc.ptr.field_1.value);
  }
  return this_local._7_1_;
}

Assistant:

bool EventLoop::turn() {
  _::Event* event = head;

  if (event == nullptr) {
    // No events in the queue.
    return false;
  } else {
    head = event->next;
    if (head != nullptr) {
      head->prev = &head;
    }

    depthFirstInsertPoint = &head;
    if (breadthFirstInsertPoint == &event->next) {
      breadthFirstInsertPoint = &head;
    }
    if (tail == &event->next) {
      tail = &head;
    }

    event->next = nullptr;
    event->prev = nullptr;

    Maybe<Own<_::Event>> eventToDestroy;
    {
      event->firing = true;
      KJ_DEFER(event->firing = false);
      currentlyFiring = event;
      KJ_DEFER(currentlyFiring = nullptr);
      eventToDestroy = event->fire();
    }

    depthFirstInsertPoint = &head;
    return true;
  }
}